

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnRefNullExpr(BinaryReaderIR *this,Type type)

{
  bool *pbVar1;
  Result RVar2;
  pointer *__ptr;
  Type local_28;
  Type local_20;
  Type local_18;
  
  pbVar1 = &(this->module_->features_used).exceptions;
  *pbVar1 = (bool)(*pbVar1 | type.enum_ == ExnRef);
  local_18 = type;
  std::make_unique<wabt::RefTypeExpr<(wabt::ExprType)37>,wabt::Type&>(&local_28);
  local_20 = local_28;
  local_28.enum_ = Any;
  local_28.type_index_ = 0;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_20);
  if (local_20 != (Type)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  if (local_28 != (Type)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnRefNullExpr(Type type) {
  module_->features_used.exceptions |= (type == Type::ExnRef);
  return AppendExpr(std::make_unique<RefNullExpr>(type));
}